

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

int32 dict_read(FILE *fp,dict_t *d)

{
  char *line;
  dictword_t *pdVar1;
  short sVar2;
  uint uVar3;
  int32 extraout_EAX;
  char **ptr;
  lineiter_t *li;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint max_ptr;
  char *in_stack_ffffffffffffff98;
  s3cipid_t *local_48;
  ulong local_38;
  int iVar4;
  
  local_48 = (s3cipid_t *)
             __ckd_calloc__(0x204,2,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                            ,0x9d);
  ptr = (char **)__ckd_calloc__(0x200,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                ,0x9e);
  li = lineiter_start(fp);
  max_ptr = 0x200;
  uVar7 = 0;
  local_38 = 0;
  iVar6 = 0;
  do {
    if (li == (lineiter_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
              ,0xd2,"Dictionary size %d, allocated %d KiB for strings, %d KiB for phones\n",
              (ulong)(uint)d->n_word,
              (long)((ulong)(uint)((int)local_38 >> 0x1f) << 0x20 | local_38 & 0xffffffff) / 0x400 &
              0xffffffff,CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),iVar6 / 0x400));
      ckd_free(local_48);
      ckd_free(ptr);
      return extraout_EAX;
    }
    uVar7 = uVar7 + 1;
    line = li->buf;
    if (*line == ';') {
      if (line[1] != ';') goto LAB_00121e12;
    }
    else if ((*line != '#') || (line[1] != '#')) {
LAB_00121e12:
      uVar3 = str2words(line,ptr,max_ptr);
      if ((int)uVar3 < 0) {
        uVar3 = str2words(li->buf,(char **)0x0,0);
        if ((int)uVar3 <= (int)max_ptr) {
          __assert_fail("nwd > maxwd",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                        ,0xab,"int32 dict_read(FILE *, dict_t *)");
        }
        local_48 = (s3cipid_t *)
                   __ckd_realloc__(local_48,(ulong)uVar3 * 2 + 8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                   ,0xad);
        ptr = (char **)__ckd_realloc__(ptr,(ulong)uVar3 << 3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                       ,0xae);
        max_ptr = uVar3;
      }
      if (uVar3 == 1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0xb6,"Line %d: No pronunciation for word \'%s\'; ignored\n",(ulong)uVar7,*ptr);
      }
      else if (uVar3 != 0) {
        for (lVar8 = 1; lVar8 < (int)uVar3; lVar8 = lVar8 + 1) {
          if (d->nocase == 0) {
            iVar4 = bin_mdef_ciphone_id(d->mdef,ptr[lVar8]);
            sVar2 = (short)iVar4;
          }
          else {
            iVar4 = bin_mdef_ciphone_id_nocase(d->mdef,ptr[lVar8]);
            sVar2 = (short)iVar4;
          }
          local_48[lVar8 + -1] = sVar2;
          if (sVar2 < 0) {
            in_stack_ffffffffffffff98 = *ptr;
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                    ,0xc0,
                    "Line %d: Phone \'%s\' is missing in the acoustic model; word \'%s\' ignored\n",
                    uVar7,ptr[lVar8],in_stack_ffffffffffffff98);
            break;
          }
        }
        if (uVar3 == (uint)lVar8) {
          uVar3 = dict_add_word(d,*ptr,local_48,uVar3 - 1);
          if ((int)uVar3 < 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                    ,0xca,"Line %d: Failed to add the word \'%s\' (duplicate?); ignored\n",uVar7,
                    *ptr);
          }
          else {
            pdVar1 = d->word;
            sVar5 = strlen(pdVar1[uVar3].word);
            local_38 = local_38 + sVar5;
            iVar6 = iVar6 + pdVar1[uVar3].pronlen * 2;
          }
        }
      }
    }
    li = lineiter_next(li);
  } while( true );
}

Assistant:

static int32
dict_read(FILE * fp, dict_t * d)
{
    lineiter_t *li;
    char **wptr;
    s3cipid_t *p;
    int32 lineno, nwd;
    s3wid_t w;
    int32 i, maxwd;
    size_t stralloc, phnalloc;

    maxwd = 512;
    p = (s3cipid_t *) ckd_calloc(maxwd + 4, sizeof(*p));
    wptr = (char **) ckd_calloc(maxwd, sizeof(char *)); /* Freed below */

    lineno = 0;
    stralloc = phnalloc = 0;
    for (li = lineiter_start(fp); li; li = lineiter_next(li)) {
        lineno++;
        if (0 == strncmp(li->buf, "##", 2)
            || 0 == strncmp(li->buf, ";;", 2))
            continue;

        if ((nwd = str2words(li->buf, wptr, maxwd)) < 0) {
            /* Increase size of p, wptr. */
            nwd = str2words(li->buf, NULL, 0);
            assert(nwd > maxwd); /* why else would it fail? */
            maxwd = nwd;
            p = (s3cipid_t *) ckd_realloc(p, (maxwd + 4) * sizeof(*p));
            wptr = (char **) ckd_realloc(wptr, maxwd * sizeof(*wptr));
        }

        if (nwd == 0)           /* Empty line */
            continue;
        /* wptr[0] is the word-string and wptr[1..nwd-1] the pronunciation sequence */
        if (nwd == 1) {
            E_ERROR("Line %d: No pronunciation for word '%s'; ignored\n",
                    lineno, wptr[0]);
            continue;
        }


        /* Convert pronunciation string to CI-phone-ids */
        for (i = 1; i < nwd; i++) {
            p[i - 1] = dict_ciphone_id(d, wptr[i]);
            if (NOT_S3CIPID(p[i - 1])) {
                E_ERROR("Line %d: Phone '%s' is missing in the acoustic model; word '%s' ignored\n",
                        lineno, wptr[i], wptr[0]);
                break;
            }
        }

        if (i == nwd) {         /* All CI-phones successfully converted to IDs */
            w = dict_add_word(d, wptr[0], p, nwd - 1);
            if (NOT_S3WID(w))
                E_ERROR
                    ("Line %d: Failed to add the word '%s' (duplicate?); ignored\n",
                     lineno, wptr[0]);
            else {
                stralloc += strlen(d->word[w].word);
                phnalloc += d->word[w].pronlen * sizeof(s3cipid_t);
            }
        }
    }
    E_INFO("Dictionary size %d, allocated %d KiB for strings, %d KiB for phones\n",
           dict_size(d), (int)stralloc / 1024, (int)phnalloc / 1024);
    ckd_free(p);
    ckd_free(wptr);

    return 0;
}